

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int end_set_error(END_HANDLE end,ERROR_HANDLE error_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE error_amqp_value;
  END_INSTANCE *end_instance;
  int result;
  ERROR_HANDLE error_value_local;
  END_HANDLE end_local;
  
  if (end == (END_HANDLE)0x0) {
    end_instance._4_4_ = 0x2664;
  }
  else {
    item_value = amqpvalue_create_error(error_value);
    if (item_value == (AMQP_VALUE)0x0) {
      end_instance._4_4_ = 0x266c;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(end->composite_value,0,item_value);
      if (iVar1 == 0) {
        end_instance._4_4_ = 0;
      }
      else {
        end_instance._4_4_ = 0x2672;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return end_instance._4_4_;
}

Assistant:

int end_set_error(END_HANDLE end, ERROR_HANDLE error_value)
{
    int result;

    if (end == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        END_INSTANCE* end_instance = (END_INSTANCE*)end;
        AMQP_VALUE error_amqp_value = amqpvalue_create_error(error_value);
        if (error_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(end_instance->composite_value, 0, error_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(error_amqp_value);
        }
    }

    return result;
}